

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Point *point;
  long lVar1;
  pointer pos;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_11;
  allocator_type local_44d;
  allocator_type local_44c;
  allocator_type local_44b;
  allocator_type local_44a;
  allocator_type local_449;
  allocator_type local_448;
  allocator_type local_447;
  allocator_type local_446;
  allocator_type local_445;
  allocator_type local_444;
  allocator_type local_443;
  allocator_type local_442;
  allocator_type local_441;
  Map maze;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_420;
  vector<astar::Point,_std::allocator<astar::Point>_> path;
  vector<int,_std::allocator<int>_> local_3f0;
  vector<int,_std::allocator<int>_> local_3d8;
  vector<int,_std::allocator<int>_> local_3c0;
  vector<int,_std::allocator<int>_> local_3a8;
  vector<int,_std::allocator<int>_> local_390;
  vector<int,_std::allocator<int>_> local_378;
  vector<int,_std::allocator<int>_> local_360;
  vector<int,_std::allocator<int>_> local_348;
  vector<int,_std::allocator<int>_> local_330;
  vector<int,_std::allocator<int>_> local_318;
  vector<int,_std::allocator<int>_> local_300;
  Point local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  Point local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  AStar as;
  int local_208 [120];
  
  as.closeZone._M_h._M_buckets = &as.closeZone._M_h._M_single_bucket;
  as.map.map.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  as.map.m = 0;
  as.map.n = 0;
  as.map.map.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  as.map.map.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  as.moveType = D8;
  as.openZone.c.
  super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  as.openZone.c.
  super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  as.openZone.c.
  super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  as.closeZone._M_h._M_bucket_count = 1;
  as.closeZone._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  as.closeZone._M_h._M_element_count = 0;
  as.closeZone._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  as.closeZone._M_h._M_rehash_policy._M_next_resize = 0;
  as.closeZone._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8.x = 0;
  local_2b8.y = 0;
  uStack_2b0 = 0;
  __l._M_len = 0xc;
  __l._M_array = &local_2b8.x;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&path,__l,&local_441);
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8.x = 0;
  local_2e8.y = 0;
  uStack_2e0 = 0;
  __l_00._M_len = 0xc;
  __l_00._M_array = &local_2e8.x;
  std::vector<int,_std::allocator<int>_>::vector(&local_3f0,__l_00,&local_442);
  local_208[0x74] = 1;
  local_208[0x75] = 1;
  local_208[0x76] = 1;
  local_208[0x77] = 0;
  local_208[0x70] = 1;
  local_208[0x71] = 1;
  local_208[0x72] = 0;
  local_208[0x73] = 0;
  local_208[0x6c] = 0;
  local_208[0x6d] = 0;
  local_208[0x6e] = 1;
  local_208[0x6f] = 1;
  __l_01._M_len = 0xc;
  __l_01._M_array = local_208 + 0x6c;
  std::vector<int,_std::allocator<int>_>::vector(&local_3d8,__l_01,&local_443);
  local_208[0x68] = 0;
  local_208[0x69] = 0;
  local_208[0x6a] = 1;
  local_208[0x6b] = 0;
  local_208[100] = 0;
  local_208[0x65] = 0;
  local_208[0x66] = 0;
  local_208[0x67] = 0;
  local_208[0x60] = 0;
  local_208[0x61] = 0;
  local_208[0x62] = 1;
  local_208[99] = 0;
  __l_02._M_len = 0xc;
  __l_02._M_array = local_208 + 0x60;
  std::vector<int,_std::allocator<int>_>::vector(&local_3c0,__l_02,&local_444);
  local_208[0x5c] = 0;
  local_208[0x5d] = 0;
  local_208[0x5e] = 1;
  local_208[0x5f] = 0;
  local_208[0x58] = 0;
  local_208[0x59] = 0;
  local_208[0x5a] = 1;
  local_208[0x5b] = 0;
  local_208[0x54] = 0;
  local_208[0x55] = 0;
  local_208[0x56] = 1;
  local_208[0x57] = 0;
  __l_03._M_len = 0xc;
  __l_03._M_array = local_208 + 0x54;
  std::vector<int,_std::allocator<int>_>::vector(&local_3a8,__l_03,&local_445);
  local_208[0x50] = 0;
  local_208[0x51] = 0;
  local_208[0x52] = 1;
  local_208[0x53] = 0;
  local_208[0x4c] = 0;
  local_208[0x4d] = 0;
  local_208[0x4e] = 1;
  local_208[0x4f] = 0;
  local_208[0x48] = 0;
  local_208[0x49] = 0;
  local_208[0x4a] = 0;
  local_208[0x4b] = 0;
  __l_04._M_len = 0xc;
  __l_04._M_array = local_208 + 0x48;
  std::vector<int,_std::allocator<int>_>::vector(&local_390,__l_04,&local_446);
  local_208[0x44] = 0;
  local_208[0x45] = 0;
  local_208[0x46] = 0;
  local_208[0x47] = 0;
  local_208[0x40] = 0;
  local_208[0x41] = 0;
  local_208[0x42] = 1;
  local_208[0x43] = 0;
  local_208[0x3c] = 0;
  local_208[0x3d] = 0;
  local_208[0x3e] = 1;
  local_208[0x3f] = 0;
  __l_05._M_len = 0xc;
  __l_05._M_array = local_208 + 0x3c;
  std::vector<int,_std::allocator<int>_>::vector(&local_378,__l_05,&local_447);
  local_208[0x38] = 0;
  local_208[0x39] = 0;
  local_208[0x3a] = 1;
  local_208[0x3b] = 0;
  local_208[0x34] = 0;
  local_208[0x35] = 0;
  local_208[0x36] = 1;
  local_208[0x37] = 0;
  local_208[0x30] = 0;
  local_208[0x31] = 0;
  local_208[0x32] = 1;
  local_208[0x33] = 0;
  __l_06._M_len = 0xc;
  __l_06._M_array = local_208 + 0x30;
  std::vector<int,_std::allocator<int>_>::vector(&local_360,__l_06,&local_448);
  local_208[0x2c] = 0;
  local_208[0x2d] = 0;
  local_208[0x2e] = 1;
  local_208[0x2f] = 0;
  local_208[0x28] = 0;
  local_208[0x29] = 0;
  local_208[0x2a] = 0;
  local_208[0x2b] = 0;
  local_208[0x24] = 0;
  local_208[0x25] = 0;
  local_208[0x26] = 1;
  local_208[0x27] = 0;
  __l_07._M_len = 0xc;
  __l_07._M_array = local_208 + 0x24;
  std::vector<int,_std::allocator<int>_>::vector(&local_348,__l_07,&local_449);
  local_208[0x20] = 1;
  local_208[0x21] = 1;
  local_208[0x22] = 1;
  local_208[0x23] = 0;
  local_208[0x1c] = 1;
  local_208[0x1d] = 0;
  local_208[0x1e] = 0;
  local_208[0x1f] = 1;
  local_208[0x18] = 0;
  local_208[0x19] = 0;
  local_208[0x1a] = 1;
  local_208[0x1b] = 1;
  __l_08._M_len = 0xc;
  __l_08._M_array = local_208 + 0x18;
  std::vector<int,_std::allocator<int>_>::vector(&local_330,__l_08,&local_44a);
  local_208[0x14] = 0;
  local_208[0x15] = 0;
  local_208[0x16] = 0;
  local_208[0x17] = 0;
  local_208[0x10] = 0;
  local_208[0x11] = 0;
  local_208[0x12] = 0;
  local_208[0x13] = 0;
  local_208[0xc] = 0;
  local_208[0xd] = 0;
  local_208[0xe] = 0;
  local_208[0xf] = 0;
  __l_09._M_len = 0xc;
  __l_09._M_array = local_208 + 0xc;
  std::vector<int,_std::allocator<int>_>::vector(&local_318,__l_09,&local_44b);
  local_208[8] = 0;
  local_208[9] = 0;
  local_208[10] = 0;
  local_208[0xb] = 0;
  local_208[4] = 0;
  local_208[5] = 0;
  local_208[6] = 0;
  local_208[7] = 0;
  local_208[0] = 0;
  local_208[1] = 0;
  local_208[2] = 0;
  local_208[3] = 0;
  __l_10._M_len = 0xc;
  __l_10._M_array = local_208;
  std::vector<int,_std::allocator<int>_>::vector(&local_300,__l_10,&local_44c);
  __l_11._M_len = 0xc;
  __l_11._M_array = (iterator)&path;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_420,__l_11,&local_44d);
  astar::Map::Map(&maze,&local_420);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_420);
  lVar1 = 0x108;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  astar::Map::Print(&maze);
  astar::AStar::LoadMap(&as,&maze);
  local_2b8.x = 0;
  local_2b8.y = 0;
  local_2e8.x = 3;
  local_2e8.y = 3;
  astar::AStar::FindPath(&path,&as,&local_2b8,&local_2e8);
  for (pos = path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
             super__Vector_impl_data._M_start;
      pos != path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
             super__Vector_impl_data._M_finish; pos = pos + 1) {
    astar::Map::Assign(&maze,pos,8);
  }
  astar::Map::Print(&maze);
  std::_Vector_base<astar::Point,_std::allocator<astar::Point>_>::~_Vector_base
            (&path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&maze.map);
  astar::AStar::~AStar(&as);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    astar::AStar as(astar::D8);

    astar::Map maze({{0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 1, 1, 1, 1, 0, 0, 1, 1, 1, 0},
                     {0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 0, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 1, 0},
                     {0, 0, 1, 1, 1, 0, 0, 1, 1, 1, 1, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0}});
    maze.Print();
    as.LoadMap(maze);
    auto path = as.FindPath({0, 0}, {3, 3});
    for (auto& point : path) {
        maze.Assign(point, 8);
    }
    maze.Print();
    return 0;
}